

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<signed_char,signed_char,signed_char,duckdb::BinaryNumericDivideWrapper,duckdb::DivideOperator,bool,false,true>
               (char *ldata,char *rdata,char *result_data,idx_t count,ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  char cVar3;
  ulong uVar4;
  ulong idx;
  ulong uVar5;
  idx_t i;
  ulong idx_00;
  idx_t idx_01;
  ulong uVar6;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    for (idx_01 = 0; count != idx_01; idx_01 = idx_01 + 1) {
      cVar3 = BinaryNumericDivideWrapper::
              Operation<bool,duckdb::DivideOperator,signed_char,signed_char,signed_char>
                        (fun,ldata[idx_01],*rdata,mask,idx_01);
      result_data[idx_01] = cVar3;
    }
  }
  else {
    idx_00 = 0;
    for (uVar4 = 0; uVar4 != count + 0x3f >> 6; uVar4 = uVar4 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar6 = idx_00 + 0x40;
        if (count <= idx_00 + 0x40) {
          uVar6 = count;
        }
LAB_015146ae:
        for (; idx = idx_00, idx_00 < uVar6; idx_00 = idx_00 + 1) {
          cVar3 = BinaryNumericDivideWrapper::
                  Operation<bool,duckdb::DivideOperator,signed_char,signed_char,signed_char>
                            (fun,ldata[idx_00],*rdata,mask,idx_00);
          result_data[idx_00] = cVar3;
        }
      }
      else {
        uVar2 = puVar1[uVar4];
        uVar6 = idx_00 + 0x40;
        if (count <= idx_00 + 0x40) {
          uVar6 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_015146ae;
        idx = uVar6;
        if (uVar2 != 0) {
          for (uVar5 = 0; idx = idx_00 + uVar5, idx < uVar6; uVar5 = uVar5 + 1) {
            if ((uVar2 >> (uVar5 & 0x3f) & 1) != 0) {
              cVar3 = BinaryNumericDivideWrapper::
                      Operation<bool,duckdb::DivideOperator,signed_char,signed_char,signed_char>
                                (fun,ldata[uVar5 + idx_00],*rdata,mask,idx);
              result_data[uVar5 + idx_00] = cVar3;
            }
          }
        }
      }
      idx_00 = idx;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}